

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_utils.c
# Opt level: O0

int64_t number_from_bin(char *s,uint32_t len)

{
  uint local_2c;
  int c;
  uint32_t i;
  int64_t value;
  uint32_t len_local;
  char *s_local;
  
  if (len < 0x41) {
    _c = (char *)0x0;
    for (local_2c = 0; local_2c < len; local_2c = local_2c + 1) {
      _c = (char *)((long)_c * 2 + (long)(s[local_2c] + -0x30));
    }
    s_local = _c;
  }
  else {
    s_local = (char *)0x0;
  }
  return (int64_t)s_local;
}

Assistant:

int64_t number_from_bin (const char *s, uint32_t len) {
    // LLONG_MIN  = -9223372036854775808
    // LLONG_MAX  = +9223372036854775807
    // BIN(9223372036854775808) = 11010001101101110001011101011000111000100001100101
    
    // sanity check on len
    if (len > 64) return 0;
    int64_t value = 0;
    for (uint32_t i=0; i<len; ++i) {
        int c = s[i];
        value = (value << 1) + (c - '0');
    }
    return value;
}